

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall
wabt::OptionParser::AddOption
          (OptionParser *this,char short_name,char *long_name,char *help,NullCallback *callback)

{
  function<void_()> *this_00;
  allocator local_162;
  allocator local_161;
  _Any_data local_160;
  code *local_150;
  string local_140;
  string local_120;
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  string local_e0;
  Option option;
  
  std::__cxx11::string::string((string *)&local_120,long_name,&local_161);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_e0,help,&local_162);
  std::function<void_()>::function((function<void_()> *)&local_160,callback);
  local_100._8_8_ = 0;
  this_00 = (function<void_()> *)operator_new(0x20);
  std::function<void_()>::function(this_00,(function<void_()> *)&local_160);
  local_e8 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/option-parser.cc:80:17)>
             ::_M_invoke;
  local_f0 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/option-parser.cc:80:17)>
             ::_M_manager;
  local_100._M_unused._M_object = this_00;
  Option::Option(&option,short_name,&local_120,&local_140,No,&local_e0,(Callback *)&local_100);
  if (local_f0 != (code *)0x0) {
    (*local_f0)(&local_100,&local_100,__destroy_functor);
  }
  if (local_150 != (code *)0x0) {
    (*local_150)(&local_160,&local_160,__destroy_functor);
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>>::
  emplace_back<wabt::OptionParser::Option_const&>
            ((vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>> *)
             &this->options_,&option);
  Option::~Option(&option);
  return;
}

Assistant:

void OptionParser::AddOption(char short_name,
                             const char* long_name,
                             const char* help,
                             const NullCallback& callback) {
  Option option(short_name, long_name, std::string(), HasArgument::No, help,
                [callback](const char*) { callback(); });
  AddOption(option);
}